

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O0

void __thiscall
CaDiCaL::heap<CaDiCaL::score_smaller>::exchange(heap<CaDiCaL::score_smaller> *this,uint a,uint b)

{
  uint *__a;
  uint *__b;
  reference __a_00;
  reference __b_00;
  uint in_EDX;
  int __c;
  uint in_ESI;
  heap<CaDiCaL::score_smaller> *in_RDI;
  uint *j;
  uint *i;
  
  __a = (uint *)index(in_RDI,(char *)(ulong)in_ESI,in_EDX);
  __b = (uint *)index(in_RDI,(char *)(ulong)in_EDX,__c);
  __a_00 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&in_RDI->array,(ulong)*__a);
  __b_00 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&in_RDI->array,(ulong)*__b);
  std::swap<unsigned_int>(__a_00,__b_00);
  std::swap<unsigned_int>(__a,__b);
  return;
}

Assistant:

void exchange (unsigned a, unsigned b) {
    unsigned &i = index (a), &j = index (b);
    swap (array[i], array[j]);
    swap (i, j);
  }